

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

char * xmlGetEncodingAlias(char *alias)

{
  __int32_t _Var1;
  xmlCharEncodingAliasPtr pxVar2;
  int iVar3;
  __int32_t **pp_Var4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char upper [100];
  
  pxVar2 = xmlCharEncodingAliases;
  if (xmlCharEncodingAliases == (xmlCharEncodingAliasPtr)0x0 || alias == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    for (lVar8 = 0; lVar8 != 99; lVar8 = lVar8 + 1) {
      pp_Var4 = __ctype_toupper_loc();
      _Var1 = (*pp_Var4)[(byte)alias[lVar8]];
      upper[lVar8] = (char)_Var1;
      if ((char)_Var1 == '\0') break;
    }
    uVar7 = (ulong)(uint)xmlCharEncodingAliasesNb;
    if (xmlCharEncodingAliasesNb < 1) {
      uVar7 = 0;
    }
    upper[lVar8] = '\0';
    lVar8 = -0x10;
    do {
      lVar5 = lVar8;
      if (uVar7 * 0x10 == lVar5 + 0x10) {
        return (char *)0x0;
      }
      iVar3 = strcmp(*(char **)((long)&pxVar2[1].alias + lVar5),upper);
      lVar8 = lVar5 + 0x10;
    } while (iVar3 != 0);
    pcVar6 = *(char **)((long)&pxVar2[1].name + lVar5);
  }
  return pcVar6;
}

Assistant:

const char *
xmlGetEncodingAlias(const char *alias) {
    int i;
    char upper[100];

    if (alias == NULL)
	return(NULL);

    if (xmlCharEncodingAliases == NULL)
	return(NULL);

    for (i = 0;i < 99;i++) {
        upper[i] = (char) toupper((unsigned char) alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    return(xmlCharEncodingAliases[i].name);
	}
    }
    return(NULL);
}